

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void jacobi_ss_compute(int order,double alpha,double beta,double *xtab,double *weight)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_a0;
  double x;
  double r3;
  double r2;
  double r1;
  double prod;
  double p1;
  double dStack_68;
  int i;
  double dp2;
  double delta;
  double cc;
  double *c;
  double bn;
  double *b;
  double an;
  double *weight_local;
  double *xtab_local;
  double beta_local;
  double alpha_local;
  int order_local;
  
  an = (double)weight;
  weight_local = xtab;
  xtab_local = (double *)beta;
  beta_local = alpha;
  alpha_local._4_4_ = order;
  if (alpha <= -1.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_SS_COMPUTE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  -1.0 < ALPHA is required.\n");
    exit(1);
  }
  if (-1.0 < beta) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)order;
    uVar6 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    bn = (double)operator_new__(uVar6);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)alpha_local._4_4_;
    uVar6 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    cc = (double)operator_new__(uVar6);
    for (p1._4_4_ = 1; p1._4_4_ <= alpha_local._4_4_; p1._4_4_ = p1._4_4_ + 1) {
      if (((beta_local + (double)xtab_local == 0.0) && (!NAN(beta_local + (double)xtab_local))) ||
         (((double)xtab_local - beta_local == 0.0 && (!NAN((double)xtab_local - beta_local))))) {
        *(undefined8 *)((long)bn + (long)(p1._4_4_ + -1) * 8) = 0;
      }
      else {
        *(double *)((long)bn + (long)(p1._4_4_ + -1) * 8) =
             ((beta_local + (double)xtab_local) * ((double)xtab_local - beta_local)) /
             ((beta_local + (double)xtab_local + (double)(p1._4_4_ << 1)) *
             (beta_local + (double)xtab_local + (double)(p1._4_4_ * 2 + -2)));
      }
      if (p1._4_4_ == 1) {
        *(undefined8 *)cc = 0;
      }
      else {
        iVar3 = p1._4_4_ + -1;
        dVar9 = beta_local + (double)(p1._4_4_ + -1);
        dVar10 = (double)xtab_local + (double)(p1._4_4_ + -1);
        dVar11 = beta_local + (double)xtab_local;
        iVar4 = p1._4_4_ + -1;
        dVar7 = beta_local + (double)xtab_local;
        iVar5 = p1._4_4_ * 2;
        dVar8 = pow(beta_local + (double)xtab_local + (double)(p1._4_4_ * 2 + -2),2.0);
        *(double *)((long)cc + (long)(p1._4_4_ + -1) * 8) =
             ((double)iVar3 * 4.0 * dVar9 * dVar10 * (dVar11 + (double)iVar4)) /
             ((dVar7 + (double)(iVar5 + -1)) * dVar8 *
             (beta_local + (double)xtab_local + (double)(p1._4_4_ * 2 + -3)));
      }
    }
    dVar7 = lgamma(beta_local + 1.0);
    dVar8 = lgamma((double)xtab_local + 1.0);
    dVar9 = lgamma(beta_local + (double)xtab_local + 2.0);
    dVar7 = exp((dVar7 + dVar8) - dVar9);
    r1 = 1.0;
    for (p1._4_4_ = 2; p1._4_4_ <= alpha_local._4_4_; p1._4_4_ = p1._4_4_ + 1) {
      r1 = r1 * *(double *)((long)cc + (long)(p1._4_4_ + -1) * 8);
    }
    dp2 = dVar7;
    dVar8 = pow(2.0,beta_local + (double)xtab_local + 1.0);
    delta = dVar7 * dVar8 * r1;
    for (p1._4_4_ = 1; p1._4_4_ <= alpha_local._4_4_; p1._4_4_ = p1._4_4_ + 1) {
      if (p1._4_4_ == 1) {
        b = (double *)(beta_local / (double)alpha_local._4_4_);
        c = (double *)((double)xtab_local / (double)alpha_local._4_4_);
        r2 = (beta_local + 1.0) *
             (2.78 / ((double)(alpha_local._4_4_ * alpha_local._4_4_) + 4.0) +
             ((double)b * 0.768) / (double)alpha_local._4_4_);
        r3 = (double)b * 0.83 * (double)c +
             (double)b * 0.452 * (double)b + (double)c * 0.96 + (double)b * 1.48 + 1.0;
        local_a0 = (r3 - r2) / r3;
      }
      else if (p1._4_4_ == 2) {
        r2 = (beta_local + 4.1) / ((beta_local + 1.0) * (beta_local * 0.156 + 1.0));
        r3 = (((double)alpha_local._4_4_ - 8.0) * 0.06 * (beta_local * 0.12 + 1.0)) /
             (double)alpha_local._4_4_ + 1.0;
        x = ((double)xtab_local * 0.012 * (ABS(beta_local) * 0.25 + 1.0)) /
            (double)alpha_local._4_4_ + 1.0;
        local_a0 = -(r2 * r3 * x) * (1.0 - local_a0) + local_a0;
      }
      else if (p1._4_4_ == 3) {
        r2 = (beta_local * 0.28 + 1.67) / (beta_local * 0.37 + 1.0);
        r3 = (((double)alpha_local._4_4_ - 8.0) * 0.22) / (double)alpha_local._4_4_ + 1.0;
        x = ((double)xtab_local * 8.0) /
            (((double)xtab_local + 6.28) * (double)(alpha_local._4_4_ * alpha_local._4_4_)) + 1.0;
        local_a0 = -(r2 * r3 * x) * (*weight_local - local_a0) + local_a0;
      }
      else if (p1._4_4_ < alpha_local._4_4_ + -1) {
        local_a0 = weight_local[p1._4_4_ + -2] * 3.0 + -(weight_local[p1._4_4_ + -3] * 3.0) +
                   weight_local[p1._4_4_ + -4];
      }
      else if (p1._4_4_ == alpha_local._4_4_ + -1) {
        r2 = ((double)xtab_local * 0.235 + 1.0) / ((double)xtab_local * 0.119 + 0.766);
        r3 = 1.0 / ((((double)alpha_local._4_4_ - 4.0) * 0.639) /
                    (((double)alpha_local._4_4_ - 4.0) * 0.71 + 1.0) + 1.0);
        x = 1.0 / ((beta_local * 20.0) /
                   ((beta_local + 7.5) * (double)(alpha_local._4_4_ * alpha_local._4_4_)) + 1.0);
        local_a0 = r2 * r3 * x * (local_a0 - weight_local[p1._4_4_ + -3]) + local_a0;
      }
      else if (p1._4_4_ == alpha_local._4_4_) {
        r2 = ((double)xtab_local * 0.37 + 1.0) / ((double)xtab_local * 0.28 + 1.67);
        r3 = 1.0 / ((((double)alpha_local._4_4_ - 8.0) * 0.22) / (double)alpha_local._4_4_ + 1.0);
        x = 1.0 / ((beta_local * 8.0) /
                   ((beta_local + 6.28) * (double)(alpha_local._4_4_ * alpha_local._4_4_)) + 1.0);
        local_a0 = r2 * r3 * x * (local_a0 - weight_local[p1._4_4_ + -3]) + local_a0;
      }
      jacobi_ss_root(&local_a0,alpha_local._4_4_,beta_local,(double)xtab_local,
                     &stack0xffffffffffffff98,&prod,(double *)bn,(double *)cc);
      weight_local[p1._4_4_ + -1] = local_a0;
      *(double *)((long)an + (long)(p1._4_4_ + -1) * 8) = delta / (dStack_68 * prod);
    }
    r8vec_reverse(alpha_local._4_4_,weight_local);
    r8vec_reverse(alpha_local._4_4_,(double *)an);
    if (bn != 0.0) {
      operator_delete__((void *)bn);
    }
    if (cc != 0.0) {
      operator_delete__((void *)cc);
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"JACOBI_SS_COMPUTE - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  -1.0 < BETA is required.\n");
  exit(1);
}

Assistant:

void jacobi_ss_compute ( int order, double alpha, double beta, double xtab[], 
  double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_SS_COMPUTE computes a Gauss-Jacobi quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) (1-X)**ALPHA * (1+X)**BETA * F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//    Thanks to Xu Xiang of Fudan University for pointing out that
//    an earlier implementation of this routine was incorrect!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    14 May 2007
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input, int ORDER, the order.
//
//    Input, double ALPHA, BETA, the exponents of (1-X) and
//    (1+X) in the quadrature rule.  For simple Gauss-Legendre quadrature,
//    set ALPHA = BETA = 0.0.  -1.0 < ALPHA and -1.0 < BETA are required.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  double an;
  double *b;
  double bn;
  double *c;
  double cc;
  double delta;
  double dp2;
  int i;
  double p1;
  double prod;
  double r1;
  double r2;
  double r3;
  double x;
//
//  Check ALPHA and BETA.
//
  if ( alpha <= -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_SS_COMPUTE - Fatal error!\n";
    std::cerr << "  -1.0 < ALPHA is required.\n";
    exit ( 1 );
  }

  if ( beta <= -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_SS_COMPUTE - Fatal error!\n";
    std::cerr << "  -1.0 < BETA is required.\n";
    exit ( 1 );
  }

  b = new double[order];
  c = new double[order];
//
//  Set the recursion coefficients.
//
  for ( i = 1; i <= order; i++ )
  {
    if ( alpha + beta == 0.0 || beta - alpha == 0.0 )
    {
      b[i-1] = 0.0;
    }
    else
    {
      b[i-1] = ( alpha + beta ) * ( beta - alpha ) / 
             ( ( alpha + beta + double( 2 * i ) ) 
             * ( alpha + beta + double( 2 * i - 2 ) ) );
    }

    if ( i == 1 )
    {
      c[i-1] = 0.0;
    }
    else
    {
      c[i-1] = 4.0 * double( i - 1 ) 
         * ( alpha + double( i - 1 ) ) 
          * ( beta + double( i - 1 ) ) 
            * ( alpha + beta + double( i - 1 ) ) / 
            ( ( alpha + beta + double( 2 * i - 1 ) ) 
            * pow ( alpha + beta + double( 2 * i - 2 ), 2 ) 
            * ( alpha + beta + double( 2 * i - 3 ) ) );
    }
  }

  delta = exp ( lgamma ( alpha        + 1.0 ) 
              + lgamma (         beta + 1.0 ) 
              - lgamma ( alpha + beta + 2.0 ) );
  prod = 1.0;
  for ( i = 2; i <= order; i++ )
  {
    prod = prod * c[i-1];
  }
  cc = delta * pow ( 2.0, alpha + beta + 1.0 ) * prod;

  for ( i = 1; i <= order; i++ )
  {
    if ( i == 1 )
    {
      an = alpha / double( order );
      bn = beta / double( order );

      r1 = ( 1.0 + alpha ) 
        * ( 2.78 / ( 4.0 + double( order * order ) ) 
        + 0.768 * an / double( order ) );

      r2 = 1.0 + 1.48 * an + 0.96 * bn 
        + 0.452 * an * an + 0.83 * an * bn;

      x = ( r2 - r1 ) / r2;
    }
    else if ( i == 2 )
    {
      r1 = ( 4.1 + alpha ) / 
        ( ( 1.0 + alpha ) * ( 1.0 + 0.156 * alpha ) );

      r2 = 1.0 + 0.06 * ( double( order ) - 8.0 ) * 
        ( 1.0 + 0.12 * alpha ) / double( order );

      r3 = 1.0 + 0.012 * beta * 
        ( 1.0 + 0.25 * fabs ( alpha ) ) / double( order );

      x = x - r1 * r2 * r3 * ( 1.0 - x );
    }
    else if ( i == 3 )
    {
      r1 = ( 1.67 + 0.28 * alpha ) / ( 1.0 + 0.37 * alpha );

      r2 = 1.0 + 0.22 * ( double( order ) - 8.0 ) 
        / double( order );

      r3 = 1.0 + 8.0 * beta / 
        ( ( 6.28 + beta ) * double( order * order ) );

      x = x - r1 * r2 * r3 * ( xtab[0] - x );
    }
    else if ( i < order - 1 )
    {
      x = 3.0 * xtab[i-2] - 3.0 * xtab[i-3] + xtab[i-4];
    }
    else if ( i == order - 1 )
    {
      r1 = ( 1.0 + 0.235 * beta ) / ( 0.766 + 0.119 * beta );

      r2 = 1.0 / ( 1.0 + 0.639 
        * ( double( order ) - 4.0 ) 
        / ( 1.0 + 0.71 * ( double( order ) - 4.0 ) ) );

      r3 = 1.0 / ( 1.0 + 20.0 * alpha / ( ( 7.5 + alpha ) * 
        double( order * order ) ) );

      x = x + r1 * r2 * r3 * ( x - xtab[i-3] );
    }
    else if ( i == order )
    {
      r1 = ( 1.0 + 0.37 * beta ) / ( 1.67 + 0.28 * beta );

      r2 = 1.0 / 
        ( 1.0 + 0.22 * ( double( order ) - 8.0 ) 
        / double( order ) );

      r3 = 1.0 / ( 1.0 + 8.0 * alpha / 
        ( ( 6.28 + alpha ) * double( order * order ) ) );

      x = x + r1 * r2 * r3 * ( x - xtab[i-3] );
    }
    jacobi_ss_root ( &x, order, alpha, beta, &dp2, &p1, b, c );

    xtab[i-1] = x;
    weight[i-1] = cc / ( dp2 * p1 );
  }
//
//  Reverse the order of the values.
//
  r8vec_reverse ( order, xtab );
  r8vec_reverse ( order, weight );

  delete [] b;
  delete [] c;

  return;
}